

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::RenderTexture::RenderTexture
          (RenderTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,
          SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48 [2];
  undefined1 local_22;
  undefined1 local_21;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSStack_20;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program_local;
  RenderTexture *this_local;
  
  local_22 = serverSync;
  local_21 = useSync;
  pSStack_20 = texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)program;
  program_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this;
  Operation::Operation(&this->super_Operation,"RenderTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__RenderTexture_032679c8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program,program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Program>
            (local_48,program);
  Operation::readGLObject(&this->super_Operation,local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (&local_58,texture);
  Operation::readGLObject(&this->super_Operation,&local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(&local_58);
  return;
}

Assistant:

RenderTexture::RenderTexture (SharedPtr<Program> program, SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation	("RenderTexture", useSync, serverSync)
	, m_program	(program)
	, m_texture	(texture)
{
	readGLObject(SharedPtr<Object>(program));
	readGLObject(SharedPtr<Object>(texture));
}